

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

int CVmObjBigNum::precision_from_string(char *str,size_t len,int radix)

{
  uint ch;
  int iVar1;
  wchar_t wVar2;
  ulong uVar3;
  uint uVar4;
  byte *pbVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  if (radix == 0) {
    radix = radix_from_string(str,len);
    bVar6 = radix == 0x10;
  }
  else {
    bVar6 = false;
  }
  if (radix == 10) {
    iVar1 = precision_from_string(str,len);
    return iVar1;
  }
  bVar7 = len == 0;
  if (!bVar7) {
    wVar2 = utf8_ptr::s_getch(str);
    pbVar5 = (byte *)str;
    while (((uint)wVar2 < 0x80 && (iVar1 = isspace(wVar2), iVar1 != 0))) {
      str = (char *)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1)
      ;
      len = (size_t)(pbVar5 + (len - (long)str));
      bVar7 = (byte *)len == (byte *)0x0;
      if (bVar7) goto joined_r0x0023b3a6;
      wVar2 = utf8_ptr::s_getch(str);
      pbVar5 = (byte *)str;
    }
    str = (char *)pbVar5;
    if ((!bVar7) &&
       ((wVar2 = utf8_ptr::s_getch((char *)pbVar5), wVar2 == L'-' ||
        (wVar2 = utf8_ptr::s_getch((char *)pbVar5), wVar2 == L'+')))) {
      len = (size_t)(pbVar5 + (len - (long)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 &
                                                            (uint)(*pbVar5 >> 7) * 3) + 1)));
      str = (char *)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1)
      ;
    }
  }
joined_r0x0023b3a6:
  while ((((byte *)len != (byte *)0x0 && (wVar2 = utf8_ptr::s_getch(str), (uint)wVar2 < 0x80)) &&
         (iVar1 = isspace(wVar2), iVar1 != 0))) {
    len = (size_t)((byte *)str +
                  (len - (long)((byte *)str +
                               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*str >> 7) * 3) + 1)));
    str = (char *)((byte *)str +
                  (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
  }
  pbVar5 = (byte *)str;
  if (((bVar6 && (byte *)len != (byte *)0x0) && (wVar2 = utf8_ptr::s_getch(str), wVar2 == L'0')) &&
     ((wVar2 = utf8_ptr::s_getch_at(str,1), wVar2 == L'x' ||
      (wVar2 = utf8_ptr::s_getch_at(str,1), wVar2 == L'X')))) {
    uVar3 = (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3);
    pbVar5 = (byte *)str +
             (((((byte *)str)[uVar3 + 1] >> 5 & 1) != 0) + 1 &
             (uint)(((byte *)str)[uVar3 + 1] >> 7) * 3) + uVar3 + 2;
    len = (size_t)((byte *)str + (len - (long)pbVar5));
  }
  if ((byte *)len == (byte *)0x0) {
    dVar8 = 0.0;
  }
  else {
    bVar6 = false;
    iVar1 = 0;
    do {
      wVar2 = utf8_ptr::s_getch((char *)pbVar5);
      uVar4 = wVar2 + L'\xffffffd0';
      if (uVar4 < 10) {
LAB_0023b4b3:
        if (radix <= (int)uVar4) goto LAB_0023b4c9;
        if (wVar2 != L'0') {
          bVar6 = true;
        }
        iVar1 = (iVar1 + 1) - (uint)!bVar6;
        bVar7 = true;
      }
      else {
        if ((uint)(wVar2 + L'\xffffffbf') < 0x1a) {
          uVar4 = wVar2 + L'\xffffffc9';
          goto LAB_0023b4b3;
        }
        if ((uint)(wVar2 + L'\xffffff9f') < 0x1a) {
          uVar4 = wVar2 + L'\xffffffa9';
          goto LAB_0023b4b3;
        }
LAB_0023b4c9:
        bVar7 = false;
      }
      if (!bVar7) break;
      len = (size_t)(pbVar5 + (len - (long)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 &
                                                            (uint)(*pbVar5 >> 7) * 3) + 1)));
      pbVar5 = pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1;
    } while ((byte *)len != (byte *)0x0);
    dVar8 = (double)iVar1;
  }
  dVar9 = log10((double)radix);
  dVar8 = ceil(dVar9 * dVar8);
  return (int)dVar8;
}

Assistant:

int CVmObjBigNum::precision_from_string(const char *str, size_t len, int radix)
{
    /* if the radix is zero, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);

    /* for decimal values, parse the full floating point format */
    if (radix == 10)
        return precision_from_string(str, len);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* skip the sign if present */
    if (rem != 0 && (p.getch() == '-' || p.getch() == '+'))
        p.inc(&rem);

    /* skip more spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* scan digits */
    int prec, significant = FALSE;
    for (prec = 0 ; rem != 0 ; p.inc(&rem))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* it's significant if it's not a leading zero */
        if (ch != '0')
            significant = TRUE;

        /* 
         *   if we have found a significant digit so far, count this one - do
         *   not count leading zeros, whether they occur before or after the
         *   decimal point 
         */
        if (significant)
            ++prec;
    }

    /*
     *   Figure the decimal precision required to hold a number in the given
     *   radix.  This is a simple linear conversion: N base-R digits require
     *   log(R)/log(10) decimal digits.  Using log10 as our canonical log
     *   base means that log(R)/log(10) == log(R)/1 == log(R).  We of course
     *   have to round up for any fractional digits.
     */
    return (int)ceil(prec * log10((double)radix));
}